

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::
ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
::ConvertOne(ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
             *this,UnboundConversion *conv,string_view conv_string)

{
  bool bVar1;
  ostream *poVar2;
  Flags v;
  string_view s;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  BoundConversion local_240;
  UntypedFormatSpecImpl spec;
  string local_218;
  Streamable local_1f8;
  Data local_1a8;
  Data DStack_1a0;
  ostringstream ss;
  
  local_240.super_FormatConversionSpecImpl.conv_ = v|s;
  bVar1 = ArgContext::Bind(&this->arg_context_,conv,&local_240);
  if (bVar1) {
    spec.data_ = "%d";
    spec.size_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar2 = std::operator<<((ostream *)&ss,"{");
    local_1a8 = (local_240.arg_)->data_;
    DStack_1a0 = *(Data *)((long)local_240.arg_ + 8);
    args.len_ = 1;
    args.ptr_ = (pointer)&local_1a8;
    Streamable::Streamable(&local_1f8,&spec,args);
    Streamable::Print(&local_1f8,poVar2);
    poVar2 = std::operator<<(poVar2,":");
    FlagsToString_abi_cxx11_
              (&local_218,
               (str_format_internal *)(ulong)local_240.super_FormatConversionSpecImpl.flags_,v);
    std::operator<<(poVar2,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    inlined_vector_internal::
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::~Storage(&local_1f8.args_.storage_);
    if (-1 < local_240.super_FormatConversionSpecImpl.width_) {
      std::ostream::operator<<(&ss,local_240.super_FormatConversionSpecImpl.width_);
    }
    if (-1 < local_240.super_FormatConversionSpecImpl.precision_) {
      poVar2 = std::operator<<((ostream *)&ss,".");
      std::ostream::operator<<(poVar2,local_240.super_FormatConversionSpecImpl.precision_);
    }
    poVar2 = str_format_internal::operator<<
                       ((ostream *)&ss,local_240.super_FormatConversionSpecImpl.conv_);
    std::operator<<(poVar2,"}");
    std::__cxx11::stringbuf::str();
    s._M_str = (char *)local_1f8.format_;
    s._M_len = (size_t)local_1f8.args_.storage_.metadata_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                       .super_Storage<unsigned_long,_1UL,_false>.value;
    SummarizingConverter::Append(&this->converter_,s);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  return bVar1;
}

Assistant:

bool ConvertOne(const UnboundConversion& conv, string_view conv_string) {
    BoundConversion bound;
    if (!arg_context_.Bind(&conv, &bound)) return false;
    return converter_.ConvertOne(bound, conv_string);
  }